

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O1

shared_ptr<LNode> __thiscall LParser::reduce_29(LParser *this)

{
  _Head_base<0UL,_LLexer_*,_false> _Var1;
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RSI;
  shared_ptr<LNode> sVar3;
  shared_ptr<LNode> fcall;
  value_type local_30;
  
  local_30.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(*(long *)(in_RSI + 0x38) + -0x20);
  local_30.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)(in_RSI + 0x38) + -0x18);
  if (local_30.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_30.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_30.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  get_node(this,(int)in_RSI);
  _Var1._M_head_impl =
       (this->lexer)._M_t.super___uniq_ptr_impl<LLexer,_std::default_delete<LLexer>_>._M_t.
       super__Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>.
       super__Head_base<0UL,_LLexer_*,_false>._M_head_impl;
  this_00 = (this->peek).super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(this_00->token)._M_dataplus._M_p = *(int *)&(this_00->token)._M_dataplus._M_p + 1;
      UNLOCK();
    }
    else {
      *(int *)&(this_00->token)._M_dataplus._M_p = *(int *)&(this_00->token)._M_dataplus._M_p + 1;
    }
    if (this_00 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(this_00->token)._M_dataplus._M_p = *(int *)&(this_00->token)._M_dataplus._M_p + 1;
        UNLOCK();
      }
      else {
        *(int *)&(this_00->token)._M_dataplus._M_p = *(int *)&(this_00->token)._M_dataplus._M_p + 1;
      }
    }
  }
  std::vector<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_>::push_back
            ((vector<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_> *)
             (_Var1._M_head_impl + 1),&local_30);
  _Var2._M_pi = extraout_RDX;
  if (this_00 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    _Var2._M_pi = extraout_RDX_00;
  }
  if (local_30.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_01;
  }
  sVar3.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar3.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_29() {
    // FCalls : FCall FCalls
    auto fcall = this->get_node(2);
    auto fcalls = this->get_node(1);
    lnode_get<LNodeChildren>(fcalls)->value.push_front(fcall);
    return fcalls;
}